

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::computeQuadTexCoord
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,TextureGather2DCase *this,
          int param_1)

{
  Vector<float,_2> local_3c [2];
  Vector<float,_2> local_28;
  undefined1 local_1d;
  int local_1c;
  TextureGather2DCase *pTStack_18;
  int param_1_local;
  TextureGather2DCase *this_local;
  vector<float,_std::allocator<float>_> *res;
  
  local_1d = 0;
  local_1c = param_1;
  pTStack_18 = this;
  this_local = (TextureGather2DCase *)__return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  tcu::Vector<float,_2>::Vector(&local_28,-0.3,-0.4);
  tcu::Vector<float,_2>::Vector(local_3c,1.5,1.6);
  glu::TextureTestUtil::computeQuadTexCoord2D(__return_storage_ptr__,&local_28,local_3c);
  return __return_storage_ptr__;
}

Assistant:

vector<float> TextureGather2DCase::computeQuadTexCoord (int /* iterationNdx */) const
{
	vector<float> res;
	glu::TextureTestUtil::computeQuadTexCoord2D(res, Vec2(-0.3f, -0.4f), Vec2(1.5f, 1.6f));
	return res;
}